

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void duckdb_parquet::swap(ColumnIndex *a,ColumnIndex *b)

{
  undefined8 uVar1;
  _ColumnIndex__isset _Var2;
  type tVar3;
  undefined8 uVar4;
  _Bit_type *p_Var5;
  _Bit_pointer puVar6;
  pointer pbVar7;
  pointer plVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pbVar11;
  pointer plVar12;
  pointer plVar13;
  pointer plVar14;
  pointer local_78;
  pointer pbStack_70;
  pointer local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar4 = (a->null_pages).super_vector<bool,_std::allocator<bool>_>.
          super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
          super__Bit_iterator_base._M_p;
  p_Var5 = (a->null_pages).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  local_58 = *(undefined8 *)
              ((long)&(a->null_pages).super_vector<bool,_std::allocator<bool>_>.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base + 8);
  uStack_50 = 0;
  uVar1 = *(undefined8 *)
           ((long)&(a->null_pages).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8);
  puVar6 = (a->null_pages).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  (a->null_pages).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(a->null_pages).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (a->null_pages).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(a->null_pages).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (a->null_pages).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&a->null_pages,
             &(b->null_pages).super_vector<bool,_std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&b->null_pages);
  (b->null_pages).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
  *(undefined8 *)
   ((long)&(b->null_pages).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 8) = local_58;
  (b->null_pages).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = p_Var5;
  *(undefined8 *)
   ((long)&(b->null_pages).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 8) = uVar1;
  (b->null_pages).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       puVar6;
  pbVar7 = (a->min_values).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar9 = (a->min_values).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (a->min_values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar11 = (b->min_values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->min_values).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (a->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
  (a->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->min_values).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  (b->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  local_68 = (b->min_values).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar7;
  local_78 = (b->min_values).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_70 = (b->min_values).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  (b->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar9;
  (b->min_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  pbVar7 = (a->max_values).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar9 = (a->max_values).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (a->max_values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar11 = (b->max_values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->max_values).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (a->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
  (a->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->max_values).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  (b->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  local_68 = (b->max_values).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar7;
  local_78 = (b->max_values).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_70 = (b->max_values).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  (b->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar9;
  (b->max_values).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  tVar3 = a->boundary_order;
  a->boundary_order = b->boundary_order;
  b->boundary_order = tVar3;
  plVar8 = (a->null_counts).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  plVar12 = (a->null_counts).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
  ;
  plVar13 = (a->null_counts).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  (a->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (a->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (a->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  plVar14 = (b->null_counts).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  (a->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (b->null_counts).super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (a->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       plVar14;
  (a->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (b->null_counts).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  (b->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = plVar12
  ;
  (b->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       plVar13;
  (b->null_counts).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = plVar8;
  plVar8 = (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  plVar12 = (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
  ;
  plVar13 = (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  plVar14 = (b->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (b->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       plVar14;
  (a->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (b->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  (b->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = plVar12
  ;
  (b->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       plVar13;
  (b->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = plVar8;
  plVar8 = (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  plVar12 = (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
  ;
  plVar13 = (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  plVar14 = (b->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (b->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       plVar14;
  (a->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (b->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  (b->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = plVar12
  ;
  (b->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       plVar13;
  (b->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = plVar8;
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(ColumnIndex &a, ColumnIndex &b) {
  using ::std::swap;
  swap(a.null_pages, b.null_pages);
  swap(a.min_values, b.min_values);
  swap(a.max_values, b.max_values);
  swap(a.boundary_order, b.boundary_order);
  swap(a.null_counts, b.null_counts);
  swap(a.repetition_level_histograms, b.repetition_level_histograms);
  swap(a.definition_level_histograms, b.definition_level_histograms);
  swap(a.__isset, b.__isset);
}